

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall kj::ArrayInputStream::skip(ArrayInputStream *this,size_t bytes)

{
  size_t bytes_local;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  Fault f;
  
  _kjCondition.right = &bytes_local;
  _kjCondition.left = (this->array).size_;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = bytes <= _kjCondition.left;
  if (!_kjCondition.result) {
    bytes_local = bytes;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[36]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x102,FAILED,"array.size() >= bytes",
               "_kjCondition,\"ArrayInputStream ended prematurely.\"",&_kjCondition,
               (char (*) [36])"ArrayInputStream ended prematurely.");
    bytes_local = (this->array).size_;
    kj::_::Debug::Fault::~Fault(&f);
    _kjCondition.left = (this->array).size_;
    bytes = bytes_local;
  }
  (this->array).ptr = (this->array).ptr + bytes;
  (this->array).size_ = _kjCondition.left - bytes;
  return;
}

Assistant:

void ArrayInputStream::skip(size_t bytes) {
  KJ_REQUIRE(array.size() >= bytes, "ArrayInputStream ended prematurely.") {
    bytes = array.size();
    break;
  }
  array = array.slice(bytes, array.size());
}